

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O1

bool __thiscall split_strategy::should_split(split_strategy *this,int i_tensor,size_t next_size)

{
  split_mode sVar1;
  void *__src;
  long lVar2;
  ulong uVar3;
  size_type __n;
  gguf_context **__dest;
  undefined8 *extraout_RDX;
  undefined1 *__src_00;
  char *pcVar4;
  size_t sVar5;
  void *__dest_00;
  ulong __n_00;
  bool bVar6;
  undefined1 auVar7 [16];
  ulong uStack_30;
  
  sVar1 = (this->params).mode;
  if (sVar1 == MODE_TENSOR) {
    bVar6 = false;
    if ((0 < i_tensor) && (i_tensor < this->n_tensors)) {
      return i_tensor % (this->params).n_split_tensors == 0;
    }
  }
  else {
    if (sVar1 != MODE_SIZE) {
      pcVar4 = anon_var_dwarf_2d6;
      __src_00 = &DAT_0000011f;
      auVar7 = ggml_abort(anon_var_dwarf_2d6,0x11f,"invalid mode");
      uStack_30 = auVar7._0_8_;
      if (auVar7._8_8_ == 0 || __src_00 != (undefined1 *)0x0) {
        __n_00 = auVar7._8_8_ - (long)__src_00;
        uStack_30 = __n_00;
        if (0xf < __n_00) {
          uVar3 = std::__cxx11::string::_M_create((ulong *)pcVar4,(ulong)&uStack_30);
          *(ulong *)pcVar4 = uVar3;
          *(ulong *)((long)pcVar4 + 0x10) = uStack_30;
        }
        if (__n_00 != 0) {
          if (__n_00 == 1) {
            **(undefined1 **)pcVar4 = *__src_00;
          }
          else {
            memcpy(*(undefined1 **)pcVar4,__src_00,__n_00);
          }
        }
        *(ulong *)((long)pcVar4 + 8) = uStack_30;
        *(undefined1 *)(*(ulong *)pcVar4 + uStack_30) = 0;
        return SUB81(uStack_30,0);
      }
      pcVar4 = anon_var_dwarf_1b8;
      std::__throw_logic_error(anon_var_dwarf_1b8);
      __n = std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::_M_check_len
                      ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)pcVar4,1,
                       "vector::_M_realloc_insert");
      __src = *(void **)pcVar4;
      lVar2 = *(long *)((new_allocator<gguf_context_*> *)pcVar4 + 8);
      sVar5 = (long)__src_00 - (long)__src;
      if (__n == 0) {
        __dest = (gguf_context **)0x0;
      }
      else {
        __dest = __gnu_cxx::new_allocator<gguf_context_*>::allocate
                           ((new_allocator<gguf_context_*> *)pcVar4,__n,(void *)0x0);
      }
      __dest[(long)sVar5 >> 3] = (gguf_context *)*extraout_RDX;
      if (0 < (long)sVar5) {
        memmove(__dest,__src,sVar5);
      }
      __dest_00 = (void *)((long)__dest + sVar5 + 8);
      sVar5 = lVar2 - (long)__src_00;
      if (0 < (long)sVar5) {
        memmove(__dest_00,__src_00,sVar5);
      }
      if (__src != (void *)0x0) {
        operator_delete(__src,*(long *)((new_allocator<gguf_context_*> *)pcVar4 + 0x10) -
                              (long)__src);
      }
      *(gguf_context ***)pcVar4 = __dest;
      *(size_t *)((new_allocator<gguf_context_*> *)pcVar4 + 8) = (long)__dest_00 + sVar5;
      *(gguf_context ***)((new_allocator<gguf_context_*> *)pcVar4 + 0x10) = __dest + __n;
      return SUB81(__dest + __n,0);
    }
    bVar6 = (this->params).n_bytes_split < next_size;
  }
  return bVar6;
}

Assistant:

bool should_split(int i_tensor, size_t next_size) {
        if (params.mode == MODE_SIZE) {
            // split by max size per file
            return next_size > params.n_bytes_split;
        } else if (params.mode == MODE_TENSOR) {
            // split by number of tensors per file
            return i_tensor > 0 && i_tensor < n_tensors && i_tensor % params.n_split_tensors == 0;
        }
        // should never happen
        GGML_ABORT("invalid mode");
    }